

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

RealType __thiscall OpenMD::EAMAdapter::getA(EAMAdapter *this)

{
  ZhouParameters zhouParam;
  undefined8 local_f0;
  EAMAdapter *in_stack_ffffffffffffffa8;
  
  getZhouParam(in_stack_ffffffffffffffa8);
  ZhouParameters::~ZhouParameters(local_f0);
  return (RealType)local_f0;
}

Assistant:

RealType EAMAdapter::getA() {
    ZhouParameters zhouParam = getZhouParam();
    return zhouParam.A;
  }